

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int __thiscall ON_SubDEdgeSharpness::Trend(ON_SubDEdgeSharpness *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  
  fVar1 = this->m_edge_sharpness[0];
  fVar2 = this->m_edge_sharpness[1];
  iVar3 = 1;
  if (fVar2 <= fVar1) {
    iVar3 = -1;
    if ((fVar1 <= fVar2) && (iVar3 = -0x7fffffff, fVar1 == fVar2)) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ON_SubDEdgeSharpness::Trend() const
{

  if (m_edge_sharpness[0] < m_edge_sharpness[1])
    return 1;
  if (m_edge_sharpness[0] > m_edge_sharpness[1])
    return -1;
  if (m_edge_sharpness[0] == m_edge_sharpness[1])
    return 0;
  return ON_UNSET_INT_INDEX;
}